

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_3dm_properties.cpp
# Opt level: O1

bool __thiscall ON_3dmRevisionHistory::Read(ON_3dmRevisionHistory *this,ON_BinaryArchive *file)

{
  int iVar1;
  bool bVar2;
  long lVar3;
  tm *ptVar4;
  tm *ptVar5;
  byte bVar6;
  int major_version;
  int minor_version;
  int local_30 [2];
  
  bVar6 = 0;
  ON_wString::operator=(&this->m_sCreatedBy,&Empty.m_sCreatedBy);
  ON_wString::operator=(&this->m_sLastEditedBy,&Empty.m_sLastEditedBy);
  ptVar4 = &Empty.m_create_time;
  ptVar5 = &this->m_create_time;
  for (lVar3 = 0xe; lVar3 != 0; lVar3 = lVar3 + -1) {
    iVar1 = ptVar4->tm_min;
    ptVar5->tm_sec = ptVar4->tm_sec;
    ptVar5->tm_min = iVar1;
    ptVar4 = (tm *)((long)ptVar4 + ((ulong)bVar6 * -2 + 1) * 8);
    ptVar5 = (tm *)((long)ptVar5 + (ulong)bVar6 * -0x10 + 8);
  }
  this->m_revision_count = Empty.m_revision_count;
  local_30[0] = 0;
  local_30[1] = 0;
  bVar2 = ON_BinaryArchive::Read3dmChunkVersion(file,local_30,local_30 + 1);
  if ((bVar2) && (local_30[0] == 1)) {
    bVar2 = ON_BinaryArchive::ReadString(file,&this->m_sCreatedBy);
    if (bVar2) {
      bVar2 = ON_BinaryArchive::ReadTime(file,&this->m_create_time);
    }
    if (bVar2 != false) {
      bVar2 = ON_BinaryArchive::ReadString(file,&this->m_sLastEditedBy);
    }
    if (bVar2 != false) {
      bVar2 = ON_BinaryArchive::ReadTime(file,&this->m_last_edit_time);
    }
    if (bVar2 != false) {
      bVar2 = ON_BinaryArchive::ReadInt(file,&this->m_revision_count);
    }
  }
  return bVar2;
}

Assistant:

bool ON_3dmRevisionHistory::Read( ON_BinaryArchive& file )
{
  *this = ON_3dmRevisionHistory::Empty;
  int major_version = 0;
  int minor_version = 0;
  bool rc = file.Read3dmChunkVersion( &major_version, &minor_version );
  if ( rc && major_version == 1 ) {
    rc = file.ReadString( m_sCreatedBy );
    if (rc) rc = file.ReadTime( m_create_time );
    if (rc) rc = file.ReadString( m_sLastEditedBy );
    if (rc) rc = file.ReadTime(m_last_edit_time );
    if (rc) rc = file.ReadInt( &m_revision_count );
  }
  return rc;
}